

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_send_reset_query(rtr_socket *rtr_socket)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  pdu_reset_query pdu;
  undefined1 local_20;
  undefined1 local_1f;
  undefined2 local_1e;
  undefined4 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  lrtr_dbg("RTR Socket: Sending reset query");
  local_20 = (undefined1)rtr_socket->version;
  local_1f = 2;
  local_1e = 0;
  local_1c = 8;
  iVar1 = rtr_send_pdu(rtr_socket,&local_20,8);
  if (iVar1 != 0) {
    rtr_change_socket_state(rtr_socket,RTR_ERROR_TRANSPORT);
    iVar2 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_send_reset_query(struct rtr_socket *rtr_socket)
{
	RTR_DBG1("Sending reset query");
	struct pdu_reset_query pdu;

	pdu.ver = rtr_socket->version;
	pdu.type = 2;
	pdu.flags = 0;
	pdu.len = 8;

	if (rtr_send_pdu(rtr_socket, &pdu, sizeof(pdu)) != RTR_SUCCESS) {
		rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
		return RTR_ERROR;
	}
	return RTR_SUCCESS;
}